

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall
solitaire::LayoutTests_getFoundationPilePosition_Test::TestBody
          (LayoutTests_getFoundationPilePosition_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Position pilePosition4;
  Position pilePosition3;
  Position pilePosition2;
  Position pilePosition1;
  AssertHelper local_a0;
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  long local_88 [3];
  Position local_70 [4];
  Position local_50;
  Position local_48;
  Position local_40;
  PileId local_34;
  PileId local_30;
  PileId local_2c;
  PileId local_28;
  PileId local_24;
  Position local_20;
  
  local_20.x = 0x11b;
  local_20.y = 0x1e;
  local_40.x = 0x174;
  local_40.y = 0x1e;
  local_48.x = 0x1cd;
  local_48.y = 0x1e;
  local_50.x = 0x226;
  local_50.y = 0x1e;
  local_24.t = 0;
  local_70[0] = Layout::getFoundationPilePosition(&local_24);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&local_98,"Layout::getFoundationPilePosition(PileId {0})","pilePosition1",
             local_70,&local_20);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_70[0] != (Position)0x0) {
      (**(code **)(*(long *)local_70[0] + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_28.t = 1;
  local_70[0] = Layout::getFoundationPilePosition(&local_28);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&local_98,"Layout::getFoundationPilePosition(PileId {1})","pilePosition2",
             local_70,&local_40);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_70[0] != (Position)0x0) {
      (**(code **)(*(long *)local_70[0] + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_2c.t = 2;
  local_70[0] = Layout::getFoundationPilePosition(&local_2c);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&local_98,"Layout::getFoundationPilePosition(PileId {2})","pilePosition3",
             local_70,&local_48);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_70[0] != (Position)0x0) {
      (**(code **)(*(long *)local_70[0] + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_30.t = 3;
  local_70[0] = Layout::getFoundationPilePosition(&local_30);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&local_98,"Layout::getFoundationPilePosition(PileId {3})","pilePosition4",
             local_70,&local_50);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_70);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_70[0] != (Position)0x0) {
      (**(code **)(*(long *)local_70[0] + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_88[1] = 0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88[0] = 0;
  local_98 = local_88;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_34.t = 4;
    Layout::getFoundationPilePosition(&local_34);
  }
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)pbStack_90,0x27624d);
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/LayoutTests.cpp"
             ,0x15,(char *)local_98);
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if (local_70[0] != (Position)0x0) {
    (**(code **)(*(long *)local_70[0] + 8))();
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

TEST(LayoutTests, getFoundationPilePosition) {
    Position pilePosition1 {283, 30};
    Position pilePosition2 {372, 30};
    Position pilePosition3 {461, 30};
    Position pilePosition4 {550, 30};

    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {0}), pilePosition1);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {1}), pilePosition2);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {2}), pilePosition3);
    EXPECT_EQ(Layout::getFoundationPilePosition(PileId {3}), pilePosition4);
    EXPECT_THROW(Layout::getFoundationPilePosition(PileId {4}), std::runtime_error);
}